

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

int __thiscall
cbtAlignedObjectArray<unsigned_short>::copy
          (cbtAlignedObjectArray<unsigned_short> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  unsigned_short *puVar1;
  long in_RCX;
  int i;
  long lVar2;
  
  puVar1 = this->m_data;
  for (lVar2 = (long)(int)dst; lVar2 < (int)src; lVar2 = lVar2 + 1) {
    *(unsigned_short *)(in_RCX + lVar2 * 2) = puVar1[lVar2];
  }
  return (int)puVar1;
}

Assistant:

SIMD_FORCE_INLINE void copy(int start, int end, T* dest) const
	{
		int i;
		for (i = start; i < end; ++i)
#ifdef BT_USE_PLACEMENT_NEW
			new (&dest[i]) T(m_data[i]);
#else
			dest[i] = m_data[i];
#endif  //BT_USE_PLACEMENT_NEW
	}